

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

string * __thiscall re2::Prog::DumpUnanchored_abi_cxx11_(string *__return_storage_ptr__,Prog *this)

{
  int in_ECX;
  undefined4 in_register_0000000c;
  Workq q;
  
  if (this->did_flatten_ == true) {
    FlattenedProgToString_abi_cxx11_
              (__return_storage_ptr__,(re2 *)this,(Prog *)(ulong)(uint)this->start_unanchored_,
               in_ECX);
  }
  else {
    SparseSetT<void>::SparseSetT((SparseSetT<void> *)&stack0xffffffffffffffc0,this->size_);
    AddToQueue((SparseSetT<void> *)&stack0xffffffffffffffc0,this->start_unanchored_);
    ProgToString_abi_cxx11_
              (__return_storage_ptr__,(re2 *)this,(Prog *)&stack0xffffffffffffffc0,
               (Workq *)CONCAT44(in_register_0000000c,in_ECX));
    SparseSetT<void>::~SparseSetT((SparseSetT<void> *)&stack0xffffffffffffffc0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Prog::DumpUnanchored() {
  if (did_flatten_)
    return FlattenedProgToString(this, start_unanchored_);

  Workq q(size_);
  AddToQueue(&q, start_unanchored_);
  return ProgToString(this, &q);
}